

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPF.cpp
# Opt level: O3

void __thiscall Storage::Disk::IPF::IPF(IPF *this,string *file_name)

{
  FileHolder *this_00;
  _Rb_tree_color _Var1;
  _Base_ptr p_Var2;
  bool bVar3;
  uint8_t uVar4;
  byte bVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  _Rb_tree_color _Var8;
  long lVar9;
  iterator iVar10;
  _Base_ptr p_Var11;
  _Rb_tree_iterator<std::pair<const_Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription>_>
  _Var12;
  undefined4 *puVar13;
  _Base_ptr p_Var14;
  _Base_ptr p_Var15;
  int iVar16;
  pair<std::_Rb_tree_iterator<std::pair<const_Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription>_>,_bool>
  pVar17;
  Address address;
  uint32_t data_key;
  map<unsigned_int,_Storage::Disk::Track::Address,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Storage::Disk::Track::Address>_>_>
  tracks_by_data_key;
  Address local_98;
  _Base_ptr local_90;
  TrackDescription local_88;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Storage::Disk::Track::Address>,_std::_Select1st<std::pair<const_unsigned_int,_Storage::Disk::Track::Address>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Storage::Disk::Track::Address>_>_>
  local_60;
  
  (this->super_DiskImage)._vptr_DiskImage = (_func_int **)&PTR__IPF_005a2628;
  (this->super_TypeDistinguisher)._vptr_TypeDistinguisher = (_func_int **)&DAT_005a2688;
  this_00 = &this->file_;
  FileHolder::FileHolder(this_00,file_name,ReadWrite);
  local_90 = &(this->tracks_)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->tracks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->tracks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->tracks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_90;
  (this->tracks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_90;
  (this->tracks_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->is_sps_format_ = false;
  this->platform_type_ = 0x80;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    lVar9 = FileHolder::tell(this_00);
    uVar6 = FileHolder::get32be(this_00);
    uVar7 = FileHolder::get32be(this_00);
    FileHolder::get32be(this_00);
    bVar3 = FileHolder::eof(this_00);
    if (bVar3) {
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Storage::Disk::Track::Address>,_std::_Select1st<std::pair<const_unsigned_int,_Storage::Disk::Track::Address>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Storage::Disk::Track::Address>_>_>
      ::~_Rb_tree(&local_60);
      return;
    }
    if (lVar9 == 0) {
      if (uVar6 != 0x43415053) {
LAB_0043310f:
        puVar13 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar13 = 0xfffffffe;
        __cxa_throw(puVar13,&Error::typeinfo,0);
      }
    }
    else if ((int)uVar6 < 0x494d4745) {
      if (uVar6 == 0x44415441) {
        uVar6 = FileHolder::get32be(this_00);
        FileHolder::seek(this_00,8,1);
        _Var8 = FileHolder::get32be(this_00);
        uVar7 = uVar7 + uVar6;
        if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          p_Var11 = &local_60._M_impl.super__Rb_tree_header._M_header;
          p_Var2 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
          do {
            p_Var14 = p_Var2;
            p_Var15 = p_Var11;
            _Var1 = p_Var14[1]._M_color;
            p_Var11 = p_Var14;
            if (_Var1 < _Var8) {
              p_Var11 = p_Var15;
            }
            p_Var2 = (&p_Var14->_M_left)[_Var1 < _Var8];
          } while ((&p_Var14->_M_left)[_Var1 < _Var8] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var11 != &local_60._M_impl.super__Rb_tree_header) {
            if (_Var1 < _Var8) {
              p_Var14 = p_Var15;
            }
            if ((p_Var14[1]._M_color <= _Var8) &&
               (iVar10 = std::
                         _Rb_tree<Storage::Disk::Track::Address,_std::pair<const_Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription>,_std::_Select1st<std::pair<const_Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription>_>,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription>_>_>
                         ::find(&(this->tracks_)._M_t,(key_type *)&p_Var11[1].field_0x4),
               iVar10._M_node != local_90)) {
              p_Var11 = (_Base_ptr)FileHolder::tell(this_00);
              iVar10._M_node[1]._M_parent = p_Var11;
            }
          }
        }
      }
      else {
        if (uVar6 == 0x43415053) goto LAB_0043310f;
LAB_004330a8:
        printf("Ignoring %c%c%c%c, starting at %ld of length %d\n",(ulong)(uVar6 >> 0x18),
               (ulong)(uVar6 >> 0x10 & 0xff),(ulong)(uVar6 >> 8 & 0xff),(ulong)(uVar6 & 0xff),lVar9,
               uVar7);
      }
    }
    else if (uVar6 == 0x494d4745) {
      uVar6 = FileHolder::get32be(this_00);
      local_98.head = FileHolder::get32be(this_00);
      local_98.position.position_ = uVar6 << 2;
      local_88.data_bits = 0;
      local_88.gap_bits = 0;
      local_88.block_count = 0;
      local_88.has_fuzzy_bits = false;
      local_88._29_3_ = 0;
      local_88.file_offset = 0;
      local_88.density = Unknown;
      local_88.start_bit_pos = 0;
      pVar17 = std::
               _Rb_tree<Storage::Disk::Track::Address,std::pair<Storage::Disk::Track::Address_const,Storage::Disk::IPF::TrackDescription>,std::_Select1st<std::pair<Storage::Disk::Track::Address_const,Storage::Disk::IPF::TrackDescription>>,std::less<Storage::Disk::Track::Address>,std::allocator<std::pair<Storage::Disk::Track::Address_const,Storage::Disk::IPF::TrackDescription>>>
               ::
               _M_emplace_unique<Storage::Disk::Track::Address_const&,Storage::Disk::IPF::TrackDescription>
                         ((_Rb_tree<Storage::Disk::Track::Address,std::pair<Storage::Disk::Track::Address_const,Storage::Disk::IPF::TrackDescription>,std::_Select1st<std::pair<Storage::Disk::Track::Address_const,Storage::Disk::IPF::TrackDescription>>,std::less<Storage::Disk::Track::Address>,std::allocator<std::pair<Storage::Disk::Track::Address_const,Storage::Disk::IPF::TrackDescription>>>
                           *)&this->tracks_,&local_98,&local_88);
      _Var12 = pVar17.first._M_node;
      uVar6 = FileHolder::get32be(this_00);
      if (9 < (int)uVar6) {
        uVar6 = 0;
      }
      *(uint32_t *)&_Var12._M_node[1]._M_left = uVar6;
      FileHolder::seek(this_00,0xc,1);
      uVar6 = FileHolder::get32be(this_00);
      *(uint32_t *)((long)&_Var12._M_node[1]._M_left + 4) = uVar6;
      uVar6 = FileHolder::get32be(this_00);
      *(uint32_t *)&_Var12._M_node[1]._M_right = uVar6;
      uVar6 = FileHolder::get32be(this_00);
      *(uint32_t *)((long)&_Var12._M_node[1]._M_right + 4) = uVar6;
      FileHolder::seek(this_00,4,1);
      _Var8 = FileHolder::get32be(this_00);
      _Var12._M_node[2]._M_color = _Var8;
      FileHolder::seek(this_00,4,1);
      uVar6 = FileHolder::get32be(this_00);
      _Var12._M_node[2].field_0x4 = (byte)uVar6 & 1;
      uVar6 = FileHolder::get32be(this_00);
      local_88.file_offset = CONCAT44(local_88.file_offset._4_4_,uVar6);
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,Storage::Disk::Track::Address>,std::_Select1st<std::pair<unsigned_int_const,Storage::Disk::Track::Address>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Storage::Disk::Track::Address>>>
      ::_M_emplace_unique<unsigned_int_const&,Storage::Disk::Track::Address_const&>
                ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,Storage::Disk::Track::Address>,std::_Select1st<std::pair<unsigned_int_const,Storage::Disk::Track::Address>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Storage::Disk::Track::Address>>>
                  *)&local_60,(uint *)&local_88,&local_98);
    }
    else {
      if (uVar6 != 0x494e464f) goto LAB_004330a8;
      uVar6 = FileHolder::get32be(this_00);
      if (uVar6 != 1) {
        puVar13 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar13 = 0xfffffffe;
        __cxa_throw(puVar13,&Error::typeinfo,0);
      }
      uVar6 = FileHolder::get32be(this_00);
      this->is_sps_format_ = 1 < uVar6;
      FileHolder::seek(this_00,0x14,1);
      uVar6 = FileHolder::get32be(this_00);
      this->track_count_ = uVar6 + 1;
      FileHolder::seek(this_00,4,1);
      uVar6 = FileHolder::get32be(this_00);
      this->head_count_ = uVar6 + 1;
      FileHolder::seek(this_00,8,1);
      this->platform_type_ = 0;
      iVar16 = 4;
      do {
        uVar4 = FileHolder::get8(this_00);
        bVar5 = uVar4 - 1;
        if ((bVar5 < 5) && ((0x1bU >> (bVar5 & 0x1f) & 1) != 0)) {
          this->platform_type_ = this->platform_type_ | *(uint *)(&DAT_004df24c + (ulong)bVar5 * 4);
        }
        iVar16 = iVar16 + -1;
      } while (iVar16 != 0);
      if (this->platform_type_ == 0) {
        this->platform_type_ = -1;
      }
    }
    FileHolder::seek(this_00,lVar9 + (ulong)uVar7,0);
  } while( true );
}

Assistant:

IPF::IPF(const std::string &file_name) : file_(file_name) {
	std::map<uint32_t, Track::Address> tracks_by_data_key;

	// For now, just build up a list of tracks that exist, noting the file position at which their data begins
	// plus the other fields that'll be necessary to convert them into flux on demand later.
	while(true) {
		const auto start_of_block = file_.tell();
		const uint32_t type = file_.get32be();
		uint32_t length = file_.get32be();						// Can't be const because of the dumb encoding of DATA blocks.
		[[maybe_unused]] const uint32_t crc = file_.get32be();
		if(file_.eof()) break;

		// Sanity check: the first thing in a file should be the CAPS record.
		if(!start_of_block && type != block("CAPS")) {
			throw Error::InvalidFormat;
		}

		switch(type) {
			default:
				printf("Ignoring %c%c%c%c, starting at %ld of length %d\n", (type >> 24), (type >> 16) & 0xff, (type >> 8) & 0xff, type & 0xff, start_of_block, length);
			break;

			case block("CAPS"):
				// Analogously to the sanity check above, if a CAPS block is anywhere other
				// than first then something is amiss.
				if(start_of_block) {
					throw Error::InvalidFormat;
				}
			break;

			case block("INFO"): {
				// There are a lot of useful archival fields in the info chunk, which for emulation
				// aren't that interesting.

				// Make sure this is a floppy disk.
				const uint32_t media_type = file_.get32be();
				if(media_type != 1) {
					throw Error::InvalidFormat;
				}

				// Determine whether this is a newer SPS-style file.
				is_sps_format_ = file_.get32be() > 1;

				// Skip: revision, file key and revision, CRC of the original .ctr, and minimum track.
				file_.seek(20, SEEK_CUR);
				track_count_ = int(1 + file_.get32be());

				// Skip: min side.
				file_.seek(4, SEEK_CUR);
				head_count_ = int(1 + file_.get32be());

				// Skip: creation date, time.
				file_.seek(8, SEEK_CUR);

				platform_type_ = 0;
				for(int c = 0; c < 4; c++) {
					const uint8_t platform = file_.get8();
					switch(platform) {
						default: break;
						case 1:	platform_type_ |= TargetPlatform::Amiga;		break;
						case 2:	platform_type_ |= TargetPlatform::AtariST;		break;
						/* Omitted: 3 -> IBM PC */
						case 4:	platform_type_ |= TargetPlatform::AmstradCPC;	break;
						case 5:	platform_type_ |= TargetPlatform::ZXSpectrum;	break;
						/* Omitted: 6 -> Sam Coupé */
						/* Omitted: 7 -> Archimedes */
						/* Omitted: 8 -> C64 */
						/* Omitted: 9 -> Atari 8-bit */
					}
				}

				// If the file didn't declare anything, default to supporting everything.
				if(!platform_type_) {
					platform_type_ = ~0;
				}

				// Ignore: disk number, creator ID, reserved area.
			} break;

			case block("IMGE"): {
				// Get track location.
				const uint32_t track = file_.get32be();
				const uint32_t side = file_.get32be();
				const Track::Address address{int(side), HeadPosition(int(track))};

				// Hence generate a TrackDescription.
				auto pair = tracks_.emplace(address, TrackDescription());
				TrackDescription &description = pair.first->second;

				// Read those fields of interest...

				// Bit density. I've no idea why the density can't just be given as a measurement.
				description.density = TrackDescription::Density(file_.get32be());
				if(description.density > TrackDescription::Density::Max) {
					description.density = TrackDescription::Density::Unknown;
				}

				file_.seek(12, SEEK_CUR);	// Skipped: signal type, track bytes, start byte position.
				description.start_bit_pos = file_.get32be();
				description.data_bits = file_.get32be();
				description.gap_bits = file_.get32be();

				file_.seek(4, SEEK_CUR);	// Skipped: track bits, which is entirely redundant.
				description.block_count = file_.get32be();

				file_.seek(4, SEEK_CUR);	// Skipped: encoder process.
				description.has_fuzzy_bits = file_.get32be() & 1;

				// For some reason the authors decided to introduce another primary key,
				// in addition to that which naturally exists of (track, side). So set up
				// a mapping from the one to the other.
				const uint32_t data_key = file_.get32be();
				tracks_by_data_key.emplace(data_key, address);
			} break;

			case block("DATA"): {
				length += file_.get32be();

				file_.seek(8, SEEK_CUR);	// Skipped: bit size, CRC.

				// Grab the data key and use that to establish the file starting
				// position for this track.
				//
				// Assumed here: DATA records will come after corresponding IMGE records.
				const uint32_t data_key = file_.get32be();
				const auto pair = tracks_by_data_key.find(data_key);
				if(pair == tracks_by_data_key.end()) {
					break;
				}

				auto description = tracks_.find(pair->second);
				if(description == tracks_.end()) {
					break;
				}
				description->second.file_offset = file_.tell();
			} break;
		}

		file_.seek(start_of_block + length, SEEK_SET);
	}
}